

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::AppendChild(Element *this,ElementPtr *child,bool dom_element)

{
  code *pcVar1;
  bool bVar2;
  int local_54;
  Element *pEStack_50;
  int i;
  Element *ancestor;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_40;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_38;
  const_iterator local_30;
  pointer local_28;
  Element *child_ptr;
  ElementPtr *pEStack_18;
  bool dom_element_local;
  ElementPtr *child_local;
  Element *this_local;
  
  child_ptr._7_1_ = dom_element;
  pEStack_18 = child;
  child_local = (ElementPtr *)this;
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)child);
  if ((!bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(child)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x533), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_28 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(child);
  if ((child_ptr._7_1_ & 1) == 0) {
    ::std::
    vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
    ::push_back(&this->children,child);
    this->num_non_dom_children = this->num_non_dom_children + 1;
  }
  else {
    local_40._M_current =
         (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
         ::std::
         vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
         ::end(&this->children);
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
               ::operator-(&local_40,(long)this->num_non_dom_children);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
    ::__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>*>
              ((__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
                *)&local_30,&local_38);
    ::std::
    vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
    ::insert(&this->children,local_30,child);
  }
  SetParent(local_28,this);
  local_54 = 0;
  for (pEStack_50 = local_28; local_54 < 3 && pEStack_50 != (Element *)0x0;
      pEStack_50 = GetParentNode(pEStack_50)) {
    (*(pEStack_50->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])();
    local_54 = local_54 + 1;
  }
  DirtyStackingContext(this);
  DirtyDefinition(this,Self);
  if ((child_ptr._7_1_ & 1) != 0) {
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
  }
  return local_28;
}

Assistant:

Element* Element::AppendChild(ElementPtr child, bool dom_element)
{
	RMLUI_ASSERT(child);
	Element* child_ptr = child.get();
	if (dom_element)
		children.insert(children.end() - num_non_dom_children, std::move(child));
	else
	{
		children.push_back(std::move(child));
		num_non_dom_children++;
	}
	// Set parent just after inserting into children. This allows us to eg. get our previous sibling in SetParent.
	child_ptr->SetParent(this);

	Element* ancestor = child_ptr;
	for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
		ancestor->OnChildAdd(child_ptr);

	DirtyStackingContext();

	// Not only does the element definition of the newly inserted element need to be dirtied, but also our own definition and implicitly all of our
	// children's. This ensures correct styles being applied in the presence of tree-structural selectors such as ':first-child'.
	DirtyDefinition(DirtyNodes::Self);

	if (dom_element)
		DirtyLayout();

	return child_ptr;
}